

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

bool __thiscall FIX::DataDictionary::getFieldName(DataDictionary *this,int field,string *name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  string *name_local;
  DataDictionary *pDStack_18;
  int field_local;
  DataDictionary *this_local;
  
  i._M_node = (_Base_ptr)name;
  name_local._4_4_ = field;
  pDStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_fieldNames,(key_type *)((long)&name_local + 4));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_fieldNames);
  bVar1 = std::operator==(&local_30,&local_38);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    std::__cxx11::string::operator=((string *)i._M_node,(string *)&ppVar2->second);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool getFieldName(int field, std::string &name) const {
    FieldToName::const_iterator i = m_fieldNames.find(field);
    if (i == m_fieldNames.end()) {
      return false;
    }
    name = i->second;
    return true;
  }